

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mips.cpp
# Opt level: O0

void __thiscall CMipsArchitecture::CMipsArchitecture(CMipsArchitecture *this)

{
  CMipsArchitecture *this_local;
  
  Architecture::Architecture(&this->super_Architecture);
  (this->super_Architecture)._vptr_Architecture = (_func_int **)&PTR_parseDirective_002a7200;
  this->FixLoadDelay = false;
  this->IgnoreLoadDelay = false;
  this->LoadDelay = false;
  this->LoadDelayRegister = 0;
  this->DelaySlot = false;
  this->Version = MARCH_INVALID;
  return;
}

Assistant:

CMipsArchitecture::CMipsArchitecture()
{
	FixLoadDelay = false;
	IgnoreLoadDelay = false;
	LoadDelay = false;
	LoadDelayRegister = 0;
	DelaySlot = false;
	Version = MARCH_INVALID;
}